

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::html_reporter::do_suite_complete(html_reporter *this)

{
  bool bVar1;
  ostream *poVar2;
  reference pdVar3;
  string *__length;
  undefined1 *puVar4;
  reporter *in_RDI;
  duration<double,_std::ratio<1L,_1L>_> *pdVar5;
  data_map *extraout_XMM0_Qa;
  data_ptr *extraout_XMM0_Qa_00;
  duration<double,_std::ratio<1L,_1L>_> e;
  iterator __end4;
  iterator __begin4;
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  *__range4;
  data_map item_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
  d;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
  *__range3_1;
  data_map item;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>
  *p;
  iterator __end3;
  iterator __begin3;
  parameters *__range3;
  data_list params;
  data_map run_item;
  run_t *r;
  iterator __end2;
  iterator __begin2;
  vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_> *__range2;
  data_map map;
  double magnitude;
  string *templ;
  string *in_stack_fffffffffffff978;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
  *in_stack_fffffffffffff980;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
  *in_stack_fffffffffffff988;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
  *in_stack_fffffffffffff990;
  allocator *in_stack_fffffffffffff998;
  data_ptr *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9b8;
  data_ptr *in_stack_fffffffffffff9c0;
  data_ptr *in_stack_fffffffffffff9c8;
  data_ptr *in_stack_fffffffffffff9d0;
  data_map *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffff9f8;
  allocator *in_stack_fffffffffffffa00;
  string local_560 [63];
  allocator local_521;
  string local_520 [24];
  string *in_stack_fffffffffffffaf8;
  html_reporter *in_stack_fffffffffffffb10;
  allocator local_4e1;
  string local_4e0 [24];
  param *in_stack_fffffffffffffb38;
  data_ptr *in_stack_fffffffffffffb40;
  undefined1 local_499 [33];
  duration<double,_std::ratio<1L,_1L>_> local_478;
  duration<double,_std::ratio<1L,_1L>_> *local_470;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
  local_468;
  undefined1 *local_460;
  undefined1 local_451 [48];
  allocator local_421;
  string local_420 [32];
  undefined1 local_400 [15];
  allocator local_3f1;
  string local_3f0 [32];
  string local_3d0 [120];
  undefined1 auStack_358 [48];
  duration<double,_std::ratio<1L,_1L>_> local_328 [4];
  duration<double,_std::ratio<1L,_1L>_> local_308 [8];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_true>
  local_2c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_true>
  local_2c0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
  *local_2b8;
  allocator local_2a9;
  string local_2a8 [87];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [88];
  reference local_1d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>
  local_1c8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>
  local_1c0;
  reference local_1b8;
  reference local_160;
  run_t *local_158;
  __normal_iterator<nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
  local_150;
  reporter *local_148;
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [48];
  string local_70 [88];
  double local_18;
  string *local_10;
  
  if (((ulong)in_RDI[1]._vptr_reporter & 0x100000000) != 0) {
    poVar2 = reporter::progress_stream(in_RDI);
    std::operator<<(poVar2,"\ngenerating HTML report\n");
  }
  local_10 = template_string_abi_cxx11_();
  local_18 = ideal_magnitude(in_stack_fffffffffffffb10);
  cpptempl::data_map::data_map((data_map *)0x1f84a1);
  escape(in_stack_fffffffffffffaf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"title",&local_a1);
  cpptempl::data_map::operator[]((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  cpptempl::data_ptr::operator=(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_70);
  nonius::detail::units_for_magnitude_abi_cxx11_((double)in_stack_fffffffffffff9b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"units",&local_e9);
  cpptempl::data_map::operator[]((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  cpptempl::data_ptr::operator=(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"logarithmic",&local_111);
  cpptempl::data_map::operator[]((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  cpptempl::data_ptr::operator=(in_stack_fffffffffffffb40,(bool *)in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"runparam",&local_139);
  cpptempl::data_map::operator[]((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  cpptempl::data_ptr::operator=(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  local_148 = in_RDI + 3;
  local_150._M_current =
       (run_t *)std::
                vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                ::begin((vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                         *)in_stack_fffffffffffff978);
  local_158 = (run_t *)std::
                       vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                       ::end((vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>
                              *)in_stack_fffffffffffff978);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
                        *)in_stack_fffffffffffff980,
                       (__normal_iterator<nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
                        *)in_stack_fffffffffffff978);
    if (!bVar1) break;
    local_160 = __gnu_cxx::
                __normal_iterator<nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
                ::operator*(&local_150);
    cpptempl::data_map::data_map((data_map *)0x1f87a0);
    std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::vector
              ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)0x1f87ad);
    local_1b8 = local_160;
    local_1c0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
                  *)in_stack_fffffffffffff978);
    local_1c8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
                *)in_stack_fffffffffffff978);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_1c0,&local_1c8);
      if (!bVar1) break;
      local_1d0 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_false,_true>
                  ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_false,_true>
                               *)0x1f8812);
      cpptempl::data_map::data_map((data_map *)0x1f8827);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"name",&local_229);
      cpptempl::data_map::operator[]
                ((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      cpptempl::data_ptr::operator=(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,"value",&local_251);
      cpptempl::data_map::operator[]
                ((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      cpptempl::data_ptr::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      cpptempl::data_ptr::data_ptr<cpptempl::data_map>
                (in_stack_fffffffffffff9a0,(data_map *)in_stack_fffffffffffff998);
      std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::push_back
                ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
                 in_stack_fffffffffffff980,(value_type *)in_stack_fffffffffffff978);
      cpptempl::data_ptr::~data_ptr((data_ptr *)0x1f898c);
      cpptempl::data_map::~data_map((data_map *)0x1f8999);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_false,_true>
                    *)in_stack_fffffffffffff980);
    }
    cpptempl::make_data((data_list *)in_stack_fffffffffffff998);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a8,"params",&local_2a9);
    cpptempl::data_map::operator[]((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    cpptempl::data_ptr::operator=
              ((data_ptr *)in_stack_fffffffffffff980,(data_ptr *)in_stack_fffffffffffff978);
    std::__cxx11::string::~string(local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    cpptempl::data_ptr::~data_ptr((data_ptr *)0x1f8c7c);
    local_2b8 = &local_160->data;
    local_2c0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
                  *)in_stack_fffffffffffff978);
    local_2c8._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
         ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>_>_>
                *)in_stack_fffffffffffff978);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_2c0,&local_2c8);
      if (!bVar1) break;
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_false,_true>
      ::operator*((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_false,_true>
                   *)0x1f8ce5);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
      ::pair(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
      cpptempl::data_map::data_map((data_map *)0x1f8d04);
      escape(in_stack_fffffffffffffaf8);
      in_stack_fffffffffffffa00 = &local_3f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f0,"name",in_stack_fffffffffffffa00);
      in_stack_fffffffffffff9f8 =
           (string *)
           cpptempl::data_map::operator[]
                     ((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      __length = local_3d0;
      cpptempl::data_ptr::operator=(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      std::__cxx11::string::~string(local_3f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      std::__cxx11::string::~string(local_3d0);
      pdVar5 = local_328;
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(pdVar5);
      truncate((char *)pdVar5,(__off_t)__length);
      in_stack_fffffffffffff9f0 = extraout_XMM0_Qa;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_420,"mean",&local_421);
      cpptempl::data_map::operator[]
                ((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      puVar4 = local_400;
      cpptempl::data_ptr::operator=(in_stack_fffffffffffffb40,(double *)in_stack_fffffffffffffb38);
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
      pdVar5 = local_308;
      std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(pdVar5);
      truncate((char *)pdVar5,(__off_t)puVar4);
      in_stack_fffffffffffff9d0 = (data_ptr *)local_451;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_451 + 1),"stddev",(allocator *)in_stack_fffffffffffff9d0);
      in_stack_fffffffffffff9c8 =
           cpptempl::data_map::operator[]
                     ((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      cpptempl::data_ptr::operator=(in_stack_fffffffffffffb40,(double *)in_stack_fffffffffffffb38);
      std::__cxx11::string::~string((string *)(local_451 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_451);
      local_460 = auStack_358;
      local_468._M_current =
           (duration<double,_std::ratio<1L,_1L>_> *)
           std::
           vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
           ::begin((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                    *)in_stack_fffffffffffff978);
      local_470 = (duration<double,_std::ratio<1L,_1L>_> *)
                  std::
                  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                  ::end((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                         *)in_stack_fffffffffffff978);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
                            *)in_stack_fffffffffffff980,
                           (__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
                            *)in_stack_fffffffffffff978);
        if (!bVar1) break;
        pdVar3 = __gnu_cxx::
                 __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
                 ::operator*(&local_468);
        local_478.__r = pdVar3->__r;
        in_stack_fffffffffffff9c0 = (data_ptr *)local_499;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_499 + 1),"samples",(allocator *)in_stack_fffffffffffff9c0);
        puVar4 = local_499 + 1;
        in_stack_fffffffffffff9b8 =
             (string *)
             cpptempl::data_map::operator[]
                       ((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
        pdVar5 = &local_478;
        std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(pdVar5);
        truncate((char *)pdVar5,(__off_t)puVar4);
        in_stack_fffffffffffffb40 = extraout_XMM0_Qa_00;
        cpptempl::data_ptr::data_ptr<double>
                  (in_stack_fffffffffffff9a0,(double *)in_stack_fffffffffffff998);
        cpptempl::data_ptr::push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
        cpptempl::data_ptr::~data_ptr((data_ptr *)0x1f9030);
        std::__cxx11::string::~string((string *)(local_499 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_499);
        __gnu_cxx::
        __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>_>
        ::operator++(&local_468);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4e0,"benchmarks",&local_4e1);
      in_stack_fffffffffffff9a0 =
           cpptempl::data_map::operator[]
                     ((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      cpptempl::data_ptr::data_ptr<cpptempl::data_map>
                (in_stack_fffffffffffff9a0,(data_map *)in_stack_fffffffffffff998);
      cpptempl::data_ptr::push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      cpptempl::data_ptr::~data_ptr((data_ptr *)0x1f92b9);
      std::__cxx11::string::~string(local_4e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
      cpptempl::data_map::~data_map((data_map *)0x1f92e0);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
      ::~pair(in_stack_fffffffffffff980);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>,_false,_true>
                    *)in_stack_fffffffffffff980);
    }
    in_stack_fffffffffffff998 = &local_521;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_520,"runs",in_stack_fffffffffffff998);
    in_stack_fffffffffffff990 =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::html_reporter::result_t>
          *)cpptempl::data_map::operator[]
                      ((data_map *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    cpptempl::data_ptr::data_ptr<cpptempl::data_map>
              (in_stack_fffffffffffff9a0,(data_map *)in_stack_fffffffffffff998);
    cpptempl::data_ptr::push_back(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
    cpptempl::data_ptr::~data_ptr((data_ptr *)0x1f9406);
    std::__cxx11::string::~string(local_520);
    std::allocator<char>::~allocator((allocator<char> *)&local_521);
    std::vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_>::~vector
              ((vector<cpptempl::data_ptr,_std::allocator<cpptempl::data_ptr>_> *)
               in_stack_fffffffffffff990);
    cpptempl::data_map::~data_map((data_map *)0x1f943a);
    __gnu_cxx::
    __normal_iterator<nonius::html_reporter::run_t_*,_std::vector<nonius::html_reporter::run_t,_std::allocator<nonius::html_reporter::run_t>_>_>
    ::operator++(&local_150);
  }
  reporter::report_stream((reporter *)0x1f94df);
  std::__cxx11::string::string(local_560,(string *)local_10);
  cpptempl::parse((ostream *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                  in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string(local_560);
  poVar2 = reporter::report_stream((reporter *)0x1f9533);
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  if (((ulong)in_RDI[1]._vptr_reporter & 0x100000000) != 0) {
    poVar2 = reporter::progress_stream(in_RDI);
    std::operator<<(poVar2,"done\n");
  }
  cpptempl::data_map::~data_map((data_map *)0x1f95ab);
  return;
}

Assistant:

void do_suite_complete() override {
            if(verbose) progress_stream() << "\ngenerating HTML report\n";

            auto&& templ = template_string();
            auto magnitude = ideal_magnitude();

            cpptempl::data_map map;
            map["title"] = escape(title);
            map["units"] = detail::units_for_magnitude(magnitude);
            map["logarithmic"] = logarithmic;
            map["runparam"] = run_param;
            for (auto&& r : runs) {
                cpptempl::data_map run_item;
                cpptempl::data_list params;
                for (auto&& p : r.params) {
                    cpptempl::data_map item;
                    item["name"] = p.first;
                    item["value"] = p.second;
                    params.push_back(item);
                }
                run_item["params"] = cpptempl::make_data(params);
                for(auto d : r.data) {
                    cpptempl::data_map item;
                    item["name"] = escape(d.first);
                    item["mean"] = truncate(d.second.analysis.mean.point.count() * magnitude);
                    item["stddev"] = truncate(d.second.analysis.standard_deviation.point.count() * magnitude);
                    for(auto e : d.second.samples)
                        item["samples"].push_back(truncate(e.count() * magnitude));
                    run_item["benchmarks"].push_back(item);
                }
                map["runs"].push_back(run_item);
            }

            cpptempl::parse(report_stream(), templ, map);
            report_stream() << std::flush;
            if(verbose) progress_stream() << "done\n";
        }